

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void convertToWithoutRowidTable(Parse *pParse,Table *pTab)

{
  byte *pbVar1;
  byte bVar2;
  short sVar3;
  sqlite3 *db;
  Vdbe *pVVar4;
  Column *pCVar5;
  short sVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  Op *pOVar10;
  size_t sVar11;
  Expr *pExpr;
  ExprList *pList;
  long lVar12;
  RenameToken *pRVar13;
  long lVar14;
  ushort uVar15;
  int iVar16;
  short *psVar17;
  uint uVar18;
  Index *pIdx;
  ulong uVar19;
  uint uVar20;
  Index *pIdx_00;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = pParse->db;
  pVVar4 = pParse->pVdbe;
  if (((db->init).field_0x6 & 2) == 0) {
    sVar6 = pTab->nCol;
    if (0 < sVar6) {
      lVar12 = 8;
      lVar14 = 0;
      do {
        pCVar5 = pTab->aCol;
        if (((*(byte *)((long)&pCVar5->zCnName + lVar12 + 6) & 1) != 0) &&
           (bVar2 = *(byte *)((long)&pCVar5->zCnName + lVar12), (bVar2 & 0xf) == 0)) {
          *(byte *)((long)&pCVar5->zCnName + lVar12) = bVar2 | 2;
          sVar6 = pTab->nCol;
        }
        lVar14 = lVar14 + 1;
        lVar12 = lVar12 + 0x10;
      } while (lVar14 < sVar6);
    }
    pbVar1 = (byte *)((long)&pTab->tabFlags + 1);
    *pbVar1 = *pbVar1 | 8;
  }
  if ((long)(pParse->u1).addrCrTab != 0) {
    if (pVVar4->db->mallocFailed == '\0') {
      pOVar10 = pVVar4->aOp + (pParse->u1).addrCrTab;
    }
    else {
      pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar10->p3 = 2;
  }
  if ((long)pTab->iPKey < 0) {
    for (pIdx_00 = pTab->pIndex; pIdx_00 != (Index *)0x0; pIdx_00 = pIdx_00->pNext) {
      if ((*(ushort *)&pIdx_00->field_0x63 & 3) == 2) goto LAB_0017f83b;
    }
    pIdx_00 = (Index *)0x0;
LAB_0017f83b:
    uVar15 = pIdx_00->nKeyCol;
    iVar16 = 1;
    if (1 < uVar15) {
      iVar16 = 1;
      uVar19 = 1;
      do {
        iVar8 = isDupColumn(pIdx_00,iVar16,pIdx_00,(int)uVar19);
        if (iVar8 == 0) {
          pIdx_00->azColl[iVar16] = pIdx_00->azColl[uVar19];
          pIdx_00->aSortOrder[iVar16] = pIdx_00->aSortOrder[uVar19];
          pIdx_00->aiColumn[iVar16] = pIdx_00->aiColumn[uVar19];
          uVar15 = pIdx_00->nKeyCol;
          iVar16 = iVar16 + 1;
        }
        else {
          pIdx_00->nColumn = pIdx_00->nColumn - 1;
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 < uVar15);
    }
    pIdx_00->nKeyCol = (u16)iVar16;
LAB_0017f97f:
    uVar15 = *(ushort *)&pIdx_00->field_0x63;
    *(ushort *)&pIdx_00->field_0x63 = uVar15 | 0x20;
    if (((db->init).field_0x6 & 2) == 0) {
      *(ushort *)&pIdx_00->field_0x63 = uVar15 | 0x28;
    }
    uVar15 = pIdx_00->nKeyCol;
    uVar7 = (uint)uVar15;
    pIdx_00->nColumn = uVar15;
    if ((pVVar4 != (Vdbe *)0x0) && ((long)(int)pIdx_00->tnum != 0)) {
      if (pVVar4->db->mallocFailed == '\0') {
        pOVar10 = pVVar4->aOp + (int)pIdx_00->tnum;
      }
      else {
        pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar10->opcode = '\t';
    }
    pIdx_00->tnum = pTab->tnum;
    pIdx = pTab->pIndex;
    if (pIdx != (Index *)0x0) {
      uVar18 = (uint)uVar15;
      do {
        if ((*(ushort *)&pIdx->field_0x63 & 3) != 2) {
          if (uVar18 != 0) {
            uVar15 = pIdx->nKeyCol;
            iVar16 = 0;
            uVar20 = 0;
            do {
              uVar9 = isDupColumn(pIdx,(uint)uVar15,pIdx_00,uVar20);
              iVar16 = iVar16 + (uVar9 ^ 1);
              uVar20 = uVar20 + 1;
            } while (uVar18 != uVar20);
            if (iVar16 != 0) {
              iVar16 = resizeIndexObject(db,pIdx,iVar16 + (uint)pIdx->nKeyCol);
              if (iVar16 == 0) {
                if (uVar7 != 0) {
                  uVar20 = (uint)pIdx->nKeyCol;
                  uVar19 = 0;
                  do {
                    iVar16 = isDupColumn(pIdx,(uint)pIdx->nKeyCol,pIdx_00,(int)uVar19);
                    if (iVar16 == 0) {
                      pIdx->aiColumn[(int)uVar20] = pIdx_00->aiColumn[uVar19];
                      pIdx->azColl[(int)uVar20] = pIdx_00->azColl[uVar19];
                      if (pIdx_00->aSortOrder[uVar19] != '\0') {
                        pIdx->field_0x64 = pIdx->field_0x64 | 4;
                      }
                      uVar20 = uVar20 + 1;
                    }
                    uVar19 = uVar19 + 1;
                  } while (uVar18 != uVar19);
                }
                goto LAB_0017fae6;
              }
              goto LAB_0017fbde;
            }
          }
          pIdx->nColumn = pIdx->nKeyCol;
        }
LAB_0017fae6:
        pIdx = pIdx->pNext;
      } while (pIdx != (Index *)0x0);
    }
    if ((long)pTab->nCol < 1) {
      iVar16 = 0;
    }
    else {
      uVar19 = 0;
      iVar16 = 0;
      psVar17 = pIdx_00->aiColumn;
      uVar18 = uVar7;
LAB_0017fb11:
      do {
        if ((int)uVar18 < 1) {
          iVar16 = iVar16 + (uint)((pTab->aCol[uVar19].colFlags & 0x20) == 0);
        }
        else {
          sVar6 = *psVar17;
          psVar17 = psVar17 + 1;
          uVar18 = uVar18 - 1;
          if (uVar19 != (uint)(int)sVar6) goto LAB_0017fb11;
        }
        uVar19 = uVar19 + 1;
        psVar17 = pIdx_00->aiColumn;
        uVar18 = uVar7;
      } while (uVar19 != (long)pTab->nCol);
    }
    iVar16 = resizeIndexObject(db,pIdx_00,iVar16 + uVar7);
    if (iVar16 == 0) {
      sVar6 = pTab->nCol;
      if (0 < sVar6) {
        uVar19 = 0;
        do {
          psVar17 = pIdx_00->aiColumn;
          uVar18 = uVar7;
          do {
            if ((int)uVar18 < 1) {
              if ((pTab->aCol[uVar19].colFlags & 0x20) == 0) {
                pIdx_00->aiColumn[(int)uVar7] = (short)uVar19;
                pIdx_00->azColl[(int)uVar7] = "BINARY";
                uVar7 = uVar7 + 1;
                sVar6 = pTab->nCol;
              }
              break;
            }
            uVar18 = uVar18 - 1;
            sVar3 = *psVar17;
            psVar17 = psVar17 + 1;
          } while (uVar19 != (uint)(int)sVar3);
          uVar19 = uVar19 + 1;
        } while ((long)uVar19 < (long)sVar6);
      }
      recomputeColumnsNotIndexed(pIdx_00);
    }
  }
  else {
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = pTab->aCol[pTab->iPKey].zCnName;
    if ((char *)local_48._0_8_ == (char *)0x0) {
      uVar7 = 0;
    }
    else {
      sVar11 = strlen((char *)local_48._0_8_);
      uVar7 = (uint)sVar11 & 0x3fffffff;
    }
    local_48._8_4_ = uVar7;
    pExpr = sqlite3ExprAlloc(db,0x3c,(Token *)local_48,0);
    pList = sqlite3ExprListAppendNew(pParse->db,pExpr);
    if (pList != (ExprList *)0x0) {
      if ((1 < pParse->eParseMode) && (pRVar13 = pParse->pRename, pRVar13 != (RenameToken *)0x0)) {
        do {
          if ((i16 *)pRVar13->p == &pTab->iPKey) {
            pRVar13->p = pList->a[0].pExpr;
            break;
          }
          pRVar13 = pRVar13->pNext;
        } while (pRVar13 != (RenameToken *)0x0);
      }
      pList->a[0].fg.sortFlags = pParse->iPkSortOrder;
      pTab->iPKey = -1;
      sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,(uint)pTab->keyConf,
                         (Token *)0x0,(Expr *)0x0,0,0,'\x02');
      if (pParse->nErr == 0) {
        for (pIdx_00 = pTab->pIndex; pIdx_00 != (Index *)0x0; pIdx_00 = pIdx_00->pNext) {
          if ((*(ushort *)&pIdx_00->field_0x63 & 3) == 2) goto LAB_0017f97f;
        }
        pIdx_00 = (Index *)0x0;
        goto LAB_0017f97f;
      }
    }
    *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags & 0x7f;
  }
LAB_0017fbde:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void convertToWithoutRowidTable(Parse *pParse, Table *pTab){
  Index *pIdx;
  Index *pPk;
  int nPk;
  int nExtra;
  int i, j;
  sqlite3 *db = pParse->db;
  Vdbe *v = pParse->pVdbe;

  /* Mark every PRIMARY KEY column as NOT NULL (except for imposter tables)
  */
  if( !db->init.imposterTable ){
    for(i=0; i<pTab->nCol; i++){
      if( (pTab->aCol[i].colFlags & COLFLAG_PRIMKEY)!=0
       && (pTab->aCol[i].notNull==OE_None)
      ){
        pTab->aCol[i].notNull = OE_Abort;
      }
    }
    pTab->tabFlags |= TF_HasNotNull;
  }

  /* Convert the P3 operand of the OP_CreateBtree opcode from BTREE_INTKEY
  ** into BTREE_BLOBKEY.
  */
  assert( !pParse->bReturning );
  if( pParse->u1.addrCrTab ){
    assert( v );
    sqlite3VdbeChangeP3(v, pParse->u1.addrCrTab, BTREE_BLOBKEY);
  }

  /* Locate the PRIMARY KEY index.  Or, if this table was originally
  ** an INTEGER PRIMARY KEY table, create a new PRIMARY KEY index.
  */
  if( pTab->iPKey>=0 ){
    ExprList *pList;
    Token ipkToken;
    sqlite3TokenInit(&ipkToken, pTab->aCol[pTab->iPKey].zCnName);
    pList = sqlite3ExprListAppend(pParse, 0,
                  sqlite3ExprAlloc(db, TK_ID, &ipkToken, 0));
    if( pList==0 ){
      pTab->tabFlags &= ~TF_WithoutRowid;
      return;
    }
    if( IN_RENAME_OBJECT ){
      sqlite3RenameTokenRemap(pParse, pList->a[0].pExpr, &pTab->iPKey);
    }
    pList->a[0].fg.sortFlags = pParse->iPkSortOrder;
    assert( pParse->pNewTable==pTab );
    pTab->iPKey = -1;
    sqlite3CreateIndex(pParse, 0, 0, 0, pList, pTab->keyConf, 0, 0, 0, 0,
                       SQLITE_IDXTYPE_PRIMARYKEY);
    if( pParse->nErr ){
      pTab->tabFlags &= ~TF_WithoutRowid;
      return;
    }
    assert( db->mallocFailed==0 );
    pPk = sqlite3PrimaryKeyIndex(pTab);
    assert( pPk->nKeyCol==1 );
  }else{
    pPk = sqlite3PrimaryKeyIndex(pTab);
    assert( pPk!=0 );

    /*
    ** Remove all redundant columns from the PRIMARY KEY.  For example, change
    ** "PRIMARY KEY(a,b,a,b,c,b,c,d)" into just "PRIMARY KEY(a,b,c,d)".  Later
    ** code assumes the PRIMARY KEY contains no repeated columns.
    */
    for(i=j=1; i<pPk->nKeyCol; i++){
      if( isDupColumn(pPk, j, pPk, i) ){
        pPk->nColumn--;
      }else{
        testcase( hasColumn(pPk->aiColumn, j, pPk->aiColumn[i]) );
        pPk->azColl[j] = pPk->azColl[i];
        pPk->aSortOrder[j] = pPk->aSortOrder[i];
        pPk->aiColumn[j++] = pPk->aiColumn[i];
      }
    }
    pPk->nKeyCol = j;
  }
  assert( pPk!=0 );
  pPk->isCovering = 1;
  if( !db->init.imposterTable ) pPk->uniqNotNull = 1;
  nPk = pPk->nColumn = pPk->nKeyCol;

  /* Bypass the creation of the PRIMARY KEY btree and the sqlite_schema
  ** table entry. This is only required if currently generating VDBE
  ** code for a CREATE TABLE (not when parsing one as part of reading
  ** a database schema).  */
  if( v && pPk->tnum>0 ){
    assert( db->init.busy==0 );
    sqlite3VdbeChangeOpcode(v, (int)pPk->tnum, OP_Goto);
  }

  /* The root page of the PRIMARY KEY is the table root page */
  pPk->tnum = pTab->tnum;

  /* Update the in-memory representation of all UNIQUE indices by converting
  ** the final rowid column into one or more columns of the PRIMARY KEY.
  */
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    int n;
    if( IsPrimaryKeyIndex(pIdx) ) continue;
    for(i=n=0; i<nPk; i++){
      if( !isDupColumn(pIdx, pIdx->nKeyCol, pPk, i) ){
        testcase( hasColumn(pIdx->aiColumn, pIdx->nKeyCol, pPk->aiColumn[i]) );
        n++;
      }
    }
    if( n==0 ){
      /* This index is a superset of the primary key */
      pIdx->nColumn = pIdx->nKeyCol;
      continue;
    }
    if( resizeIndexObject(db, pIdx, pIdx->nKeyCol+n) ) return;
    for(i=0, j=pIdx->nKeyCol; i<nPk; i++){
      if( !isDupColumn(pIdx, pIdx->nKeyCol, pPk, i) ){
        testcase( hasColumn(pIdx->aiColumn, pIdx->nKeyCol, pPk->aiColumn[i]) );
        pIdx->aiColumn[j] = pPk->aiColumn[i];
        pIdx->azColl[j] = pPk->azColl[i];
        if( pPk->aSortOrder[i] ){
          /* See ticket https://www.sqlite.org/src/info/bba7b69f9849b5bf */
          pIdx->bAscKeyBug = 1;
        }
        j++;
      }
    }
    assert( pIdx->nColumn>=pIdx->nKeyCol+n );
    assert( pIdx->nColumn>=j );
  }

  /* Add all table columns to the PRIMARY KEY index
  */
  nExtra = 0;
  for(i=0; i<pTab->nCol; i++){
    if( !hasColumn(pPk->aiColumn, nPk, i)
     && (pTab->aCol[i].colFlags & COLFLAG_VIRTUAL)==0 ) nExtra++;
  }
  if( resizeIndexObject(db, pPk, nPk+nExtra) ) return;
  for(i=0, j=nPk; i<pTab->nCol; i++){
    if( !hasColumn(pPk->aiColumn, j, i)
     && (pTab->aCol[i].colFlags & COLFLAG_VIRTUAL)==0
    ){
      assert( j<pPk->nColumn );
      pPk->aiColumn[j] = i;
      pPk->azColl[j] = sqlite3StrBINARY;
      j++;
    }
  }
  assert( pPk->nColumn==j );
  assert( pTab->nNVCol<=j );
  recomputeColumnsNotIndexed(pPk);
}